

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3ColumnType(Column *pCol,char *zDflt)

{
  char *__s;
  size_t sVar1;
  
  if ((pCol->colFlags & 4) == 0) {
    if (0xf < (byte)pCol->field_0x8) {
      zDflt = sqlite3StdType[((byte)pCol->field_0x8 >> 4) - 1];
    }
    return zDflt;
  }
  __s = pCol->zCnName;
  sVar1 = strlen(__s);
  return __s + sVar1 + 1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3ColumnType(Column *pCol, char *zDflt){
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    return pCol->zCnName + strlen(pCol->zCnName) + 1;
  }else if( pCol->eCType ){
    assert( pCol->eCType<=SQLITE_N_STDTYPE );
    return (char*)sqlite3StdType[pCol->eCType-1];
  }else{
    return zDflt;
  }
}